

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::WriteAllTarget
          (cmGlobalGhsMultiGenerator *this,cmLocalGenerator *root,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *generators,
          string *all_target)

{
  size_t *this_00;
  size_t *this_01;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  int iVar4;
  TargetType TVar5;
  undefined4 extraout_var;
  string *psVar6;
  reference pcVar7;
  char *val;
  reference ppcVar8;
  cmGeneratorTarget *target;
  iterator __end2;
  iterator __begin2;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range2;
  string rootBinaryDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  undefined1 local_4e8 [8];
  string message;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> build;
  string local_4a8;
  cmGeneratorTarget *local_488;
  cmGeneratorTarget *t_1;
  iterator __end1_1;
  iterator __begin1_1;
  OrderedTargetDependSet *__range1_1;
  cmGeneratorTarget *t;
  iterator __end1;
  iterator __begin1;
  OrderedTargetDependSet *__range1;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> defaultTargets;
  string local_428;
  undefined1 local_408 [8];
  OrderedTargetDependSet sortedProjectTargets;
  TargetDependSet originalTargets;
  TargetDependSet projectTargets;
  cmGeneratedFileStream fbld;
  undefined1 local_f8 [8];
  string fname;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *all_target_local;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *generators_local;
  cmLocalGenerator *root_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  local_28 = all_target;
  all_target_local = (string *)generators;
  generators_local = (vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)root;
  root_local = (cmLocalGenerator *)this;
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::clear
            (&this->ProjectTargets);
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_c8,(cmLocalGenerator *)generators_local);
  std::operator+(&local_a8,&local_c8,".");
  iVar4 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x17])();
  std::operator+(&local_88,&local_a8,(char *)CONCAT44(extraout_var,iVar4));
  std::operator+(&local_68,&local_88,".tgt");
  std::operator+(&local_48,&local_68,FILE_EXTENSION);
  std::__cxx11::string::operator=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)generators_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fbld.field_0x240,psVar6,"/CMakeFiles/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fbld.field_0x240,local_28);
  std::__cxx11::string::~string((string *)&fbld.field_0x240);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)
             &projectTargets.
              super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>.
              _M_t._M_impl.super__Rb_tree_header._M_node_count,(string *)local_f8,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent
            ((cmGeneratedFileStream *)
             &projectTargets.
              super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>.
              _M_t._M_impl.super__Rb_tree_header._M_node_count,true);
  WriteFileHeader(this,(ostream *)
                       &projectTargets.
                        super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                        ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GhsMultiGpj::WriteGpjTag
            (PROJECT,(ostream *)
                     &projectTargets.
                      super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                      ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  this_00 = &originalTargets.
             super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>.
             _M_t._M_impl.super__Rb_tree_header._M_node_count;
  cmTargetDependSet::cmTargetDependSet((cmTargetDependSet *)this_00);
  this_01 = &sortedProjectTargets.
             super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
             ._M_t._M_impl.super__Rb_tree_header._M_node_count;
  cmTargetDependSet::cmTargetDependSet((cmTargetDependSet *)this_01);
  cmGlobalGenerator::GetTargetSets
            (&this->super_cmGlobalGenerator,(TargetDependSet *)this_00,(TargetDependSet *)this_01,
             (cmLocalGenerator *)generators_local,(GeneratorVector *)all_target_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"",
             (allocator<char> *)
             ((long)&defaultTargets.
                     super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  OrderedTargetDependSet::OrderedTargetDependSet
            ((OrderedTargetDependSet *)local_408,
             (TargetDependSet *)
             &originalTargets.
              super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>.
              _M_t._M_impl.super__Rb_tree_header._M_node_count,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&defaultTargets.
                     super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::vector
            ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
             &__range1);
  __end1 = std::
           multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
           ::begin((multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
                    *)local_408);
  t = (cmGeneratorTarget *)
      std::
      multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
      ::end((multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
             *)local_408);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&t), bVar3) {
    pcVar7 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&__end1);
    __range1_1 = (OrderedTargetDependSet *)
                 cmTargetDepend::operator_cast_to_cmGeneratorTarget_(pcVar7);
    std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
              (&this->ProjectTargets,(value_type *)&__range1_1);
    std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&__end1);
  }
  __end1_1 = std::
             multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
             ::begin((multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
                      *)local_408);
  t_1 = (cmGeneratorTarget *)
        std::
        multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
        ::end((multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
               *)local_408);
  while (bVar3 = std::operator!=(&__end1_1,(_Self *)&t_1), bVar3) {
    pcVar7 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&__end1_1);
    local_488 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(pcVar7);
    TVar5 = cmGeneratorTarget::GetType(local_488);
    pcVar2 = local_488;
    if (TVar5 != INTERFACE_LIBRARY) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"EXCLUDE_FROM_ALL",
                 (allocator<char> *)
                 ((long)&build.
                         super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      val = cmGeneratorTarget::GetProperty(pcVar2,&local_4a8);
      bVar3 = cmSystemTools::IsOn(val);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&build.
                         super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
        push_back((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
                  &__range1,&local_488);
      }
    }
    std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&__end1_1);
  }
  pvVar1 = (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
           ((long)&message.field_2 + 8);
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::vector(pvVar1)
  ;
  bVar3 = ComputeTargetBuildOrder
                    (this,(vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                           *)&__range1,pvVar1);
  if (bVar3) {
    cmLocalGenerator::GetProjectName_abi_cxx11_
              ((string *)((long)&rootBinaryDir.field_2 + 8),(cmLocalGenerator *)generators_local);
    std::operator+(&local_508,"The inter-target dependency graph for project [",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&rootBinaryDir.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8,
                   &local_508,"] had a cycle.\n");
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)(rootBinaryDir.field_2._M_local_buf + 8));
    cmSystemTools::Error((string *)local_4e8);
    std::__cxx11::string::~string((string *)local_4e8);
  }
  else {
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       ((cmLocalGenerator *)generators_local);
    std::__cxx11::string::string((string *)&__range2,(string *)psVar6);
    std::__cxx11::string::operator+=((string *)&__range2,"/CMakeFiles");
    pvVar1 = (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
             ((long)&message.field_2 + 8);
    __end2 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
             begin(pvVar1);
    target = (cmGeneratorTarget *)
             std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::end
                       (pvVar1);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                       *)&target), bVar3) {
      ppcVar8 = __gnu_cxx::
                __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                ::operator*(&__end2);
      pcVar2 = *ppcVar8;
      TVar5 = cmGeneratorTarget::GetType(pcVar2);
      if (((TVar5 != INTERFACE_LIBRARY) &&
          (TVar5 = cmGeneratorTarget::GetType(pcVar2), TVar5 != MODULE_LIBRARY)) &&
         (TVar5 = cmGeneratorTarget::GetType(pcVar2), TVar5 != SHARED_LIBRARY)) {
        WriteProjectLine(this,(ostream *)
                              &projectTargets.
                               super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                               ._M_t._M_impl.super__Rb_tree_header._M_node_count,pcVar2,
                         (cmLocalGenerator *)generators_local,(string *)&__range2);
      }
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::~string((string *)&__range2);
  }
  cmGeneratedFileStream::Close
            ((cmGeneratedFileStream *)
             &projectTargets.
              super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>.
              _M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::~vector
            ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
             ((long)&message.field_2 + 8));
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::~vector
            ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
             &__range1);
  OrderedTargetDependSet::~OrderedTargetDependSet((OrderedTargetDependSet *)local_408);
  cmTargetDependSet::~cmTargetDependSet
            ((cmTargetDependSet *)
             &sortedProjectTargets.
              super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
              ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cmTargetDependSet::~cmTargetDependSet
            ((cmTargetDependSet *)
             &originalTargets.
              super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>.
              _M_t._M_impl.super__Rb_tree_header._M_node_count);
  cmGeneratedFileStream::~cmGeneratedFileStream
            ((cmGeneratedFileStream *)
             &projectTargets.
              super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>.
              _M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)local_f8);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteAllTarget(
  cmLocalGenerator* root, std::vector<cmLocalGenerator*>& generators,
  std::string& all_target)
{
  this->ProjectTargets.clear();

  // create target build file
  all_target = root->GetProjectName() + "." + this->GetAllTargetName() +
    ".tgt" + FILE_EXTENSION;
  std::string fname =
    root->GetCurrentBinaryDirectory() + "/CMakeFiles/" + all_target;
  cmGeneratedFileStream fbld(fname);
  fbld.SetCopyIfDifferent(true);
  this->WriteFileHeader(fbld);
  GhsMultiGpj::WriteGpjTag(GhsMultiGpj::PROJECT, fbld);

  // Collect all targets under this root generator and the transitive
  // closure of their dependencies.
  TargetDependSet projectTargets;
  TargetDependSet originalTargets;
  this->GetTargetSets(projectTargets, originalTargets, root, generators);
  OrderedTargetDependSet sortedProjectTargets(projectTargets, "");
  std::vector<cmGeneratorTarget const*> defaultTargets;
  for (cmGeneratorTarget const* t : sortedProjectTargets) {
    /* save list of all targets in sorted order */
    this->ProjectTargets.push_back(t);
  }
  for (cmGeneratorTarget const* t : sortedProjectTargets) {
    if (t->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    if (!cmSystemTools::IsOn(t->GetProperty("EXCLUDE_FROM_ALL"))) {
      defaultTargets.push_back(t);
    }
  }
  std::vector<cmGeneratorTarget const*> build;
  if (ComputeTargetBuildOrder(defaultTargets, build)) {
    std::string message = "The inter-target dependency graph for project [" +
      root->GetProjectName() + "] had a cycle.\n";
    cmSystemTools::Error(message);
  } else {
    // determine the targets for ALL target
    std::string rootBinaryDir = root->GetCurrentBinaryDirectory();
    rootBinaryDir += "/CMakeFiles";
    for (cmGeneratorTarget const* target : build) {
      if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
          target->GetType() == cmStateEnums::MODULE_LIBRARY ||
          target->GetType() == cmStateEnums::SHARED_LIBRARY) {
        continue;
      }
      this->WriteProjectLine(fbld, target, root, rootBinaryDir);
    }
  }
  fbld.Close();
}